

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimfmt.cpp
# Opt level: O2

void __thiscall
icu_63::DecimalFormat::setMinimumGroupingDigits(DecimalFormat *this,int32_t newValue)

{
  DecimalFormatProperties *pDVar1;
  
  pDVar1 = (this->fields->properties).
           super_LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>.ptr;
  if (pDVar1->minimumGroupingDigits == newValue) {
    return;
  }
  pDVar1->minimumGroupingDigits = newValue;
  touchNoError(this);
  return;
}

Assistant:

void DecimalFormat::setMinimumGroupingDigits(int32_t newValue) {
    if (newValue == fields->properties->minimumGroupingDigits) { return; }
    fields->properties->minimumGroupingDigits = newValue;
    touchNoError();
}